

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

istream * amrex::operator>>(istream *is,Geometry *g)

{
  Geometry *this;
  istream *in_RDI;
  IntVect is_per;
  char c;
  int ic;
  RealBox rb;
  Box bx;
  RealBox *in_stack_fffffffffffffed8;
  Geometry *in_stack_fffffffffffffee0;
  Array<int,_3> *in_stack_fffffffffffffee8;
  Array<int,_3> *period;
  Geometry *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  istream *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  istream *in_stack_ffffffffffffff30;
  Array<int,_3> local_a4;
  char local_95;
  int local_94;
  RealBox *in_stack_ffffffffffffffb0;
  istream *in_stack_ffffffffffffffb8;
  
  Box::Box((Box *)in_stack_fffffffffffffee0);
  RealBox::RealBox((RealBox *)in_stack_fffffffffffffee0);
  operator>>(in_stack_ffffffffffffff30,
             (CoordSys *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  operator>>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  operator>>(in_stack_ffffffffffffff20,
             (Box *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  Geometry::Domain(in_stack_fffffffffffffee0,(Box *)in_stack_fffffffffffffed8);
  Geometry::ProbDomain(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_94 = std::istream::peek();
  if (local_94 == 0x50) {
    std::operator>>(in_RDI,&local_95);
    period = &local_a4;
    IntVect::IntVect((IntVect *)period);
    operator>>((istream *)in_stack_fffffffffffffee0,(IntVect *)in_stack_fffffffffffffed8);
    Geometry::setPeriodicity(in_stack_fffffffffffffef0,period);
  }
  else {
    this = DefaultGeometry();
    Geometry::isPeriodic(this);
    Geometry::setPeriodicity(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  return in_RDI;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            Geometry&     g)
{
    Box     bx;
    RealBox rb;
    is >> (CoordSys&) g >> rb >> bx;
    g.Domain(bx);
    g.ProbDomain(rb);

    int ic = is.peek();
    if (ic == static_cast<int>('P')) {
        char c;
        is >> c;
        IntVect is_per;
        is >> is_per;
        g.setPeriodicity({{AMREX_D_DECL(is_per[0],is_per[1],is_per[2])}});
    } else {
        g.setPeriodicity(DefaultGeometry().isPeriodic());
    }

    return is;
}